

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O1

bool __thiscall mkvmuxer::Track::AddContentEncoding(Track *this)

{
  uint uVar1;
  ContentEncoding **ppCVar2;
  ContentEncoding **ppCVar3;
  ContentEncoding *this_00;
  ulong uVar4;
  uint uVar5;
  
  uVar5 = this->content_encoding_entries_size_ + 1;
  ppCVar3 = (ContentEncoding **)operator_new__((ulong)uVar5 * 8,(nothrow_t *)&std::nothrow);
  if (ppCVar3 != (ContentEncoding **)0x0) {
    this_00 = (ContentEncoding *)operator_new(0x38,(nothrow_t *)&std::nothrow);
    if (this_00 == (ContentEncoding *)0x0) {
      this_00 = (ContentEncoding *)0x0;
    }
    else {
      ContentEncoding::ContentEncoding(this_00);
    }
    if (this_00 != (ContentEncoding *)0x0) {
      uVar1 = this->content_encoding_entries_size_;
      if ((ulong)uVar1 != 0) {
        ppCVar2 = this->content_encoding_entries_;
        uVar4 = 0;
        do {
          ppCVar3[uVar4] = ppCVar2[uVar4];
          uVar4 = uVar4 + 1;
        } while (uVar1 != uVar4);
      }
      if (this->content_encoding_entries_ != (ContentEncoding **)0x0) {
        operator_delete__(this->content_encoding_entries_);
      }
      this->content_encoding_entries_ = ppCVar3;
      ppCVar3[this->content_encoding_entries_size_] = this_00;
      this->content_encoding_entries_size_ = uVar5;
      return this_00 != (ContentEncoding *)0x0;
    }
    operator_delete__(ppCVar3);
  }
  return false;
}

Assistant:

bool Track::AddContentEncoding() {
  const uint32_t count = content_encoding_entries_size_ + 1;

  ContentEncoding** const content_encoding_entries =
      new (std::nothrow) ContentEncoding*[count];  // NOLINT
  if (!content_encoding_entries)
    return false;

  ContentEncoding* const content_encoding =
      new (std::nothrow) ContentEncoding();  // NOLINT
  if (!content_encoding) {
    delete[] content_encoding_entries;
    return false;
  }

  for (uint32_t i = 0; i < content_encoding_entries_size_; ++i) {
    content_encoding_entries[i] = content_encoding_entries_[i];
  }

  delete[] content_encoding_entries_;

  content_encoding_entries_ = content_encoding_entries;
  content_encoding_entries_[content_encoding_entries_size_] = content_encoding;
  content_encoding_entries_size_ = count;
  return true;
}